

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DynamicTypeHandler::SetPrototype
          (DynamicTypeHandler *this,DynamicObject *instance,RecyclableObject *newPrototype)

{
  ResetTypeHandler(this,instance);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet
            (&((instance->super_RecyclableObject).type.ptr)->prototype,newPrototype);
  return;
}

Assistant:

void DynamicTypeHandler::SetPrototype(DynamicObject* instance, RecyclableObject* newPrototype)
    {
        // Force a type transition on the instance to invalidate its inline caches
        DynamicTypeHandler::ResetTypeHandler(instance);

        // Put new prototype in place
        instance->GetDynamicType()->SetPrototype(newPrototype);
    }